

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbPush.c
# Opt level: O0

void Acb_ObjPushToFanin(Acb_Ntk_t *p,int iObj,int iFaninIndex2,int iFanin)

{
  int iVar1;
  int iVar2;
  int iFaninGiven;
  int iVar3;
  int iVar4;
  word wVar5;
  word wVar6;
  Vec_Wrd_t *p_00;
  int local_50;
  int iFaninFaninIndex;
  int iFanin2;
  int DecType;
  int iFaninIndex;
  word uTruthFan;
  word uTruthFanNew;
  word uTruthObj;
  word uTruthObjNew;
  int local_18;
  int iFanin_local;
  int iFaninIndex2_local;
  int iObj_local;
  Acb_Ntk_t *p_local;
  
  uTruthObj = 0;
  uTruthObjNew._4_4_ = iFanin;
  local_18 = iFaninIndex2;
  iFanin_local = iObj;
  _iFaninIndex2_local = p;
  wVar5 = Acb_ObjTruth(p,iObj);
  wVar6 = Acb_ObjTruth(_iFaninIndex2_local,uTruthObjNew._4_4_);
  iVar1 = Acb_ObjWhatFanin(_iFaninIndex2_local,iFanin_local,uTruthObjNew._4_4_);
  iVar2 = Abc_TtCheckDsdAnd(wVar5,iVar1,local_18,&uTruthObj);
  iFaninGiven = Acb_ObjFanin(_iFaninIndex2_local,iFanin_local,local_18);
  local_50 = Acb_ObjWhatFanin(_iFaninIndex2_local,uTruthObjNew._4_4_,iFaninGiven);
  if (local_50 == -1) {
    local_50 = Acb_ObjFaninNum(_iFaninIndex2_local,uTruthObjNew._4_4_);
  }
  iVar3 = Acb_ObjIsCio(_iFaninIndex2_local,iFanin_local);
  if (iVar3 != 0) {
    __assert_fail("!Acb_ObjIsCio(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbPush.c"
                  ,0x69,"void Acb_ObjPushToFanin(Acb_Ntk_t *, int, int, int)");
  }
  iVar3 = Acb_ObjIsCio(_iFaninIndex2_local,uTruthObjNew._4_4_);
  if (iVar3 != 0) {
    __assert_fail("!Acb_ObjIsCio(p, iFanin)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbPush.c"
                  ,0x6a,"void Acb_ObjPushToFanin(Acb_Ntk_t *, int, int, int)");
  }
  iVar4 = Acb_ObjFaninNum(_iFaninIndex2_local,iFanin_local);
  iVar3 = local_18;
  if (iVar4 <= iVar1) {
    __assert_fail("iFaninIndex < Acb_ObjFaninNum(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbPush.c"
                  ,0x6b,"void Acb_ObjPushToFanin(Acb_Ntk_t *, int, int, int)");
  }
  iVar4 = Acb_ObjFaninNum(_iFaninIndex2_local,iFanin_local);
  if (iVar4 <= iVar3) {
    __assert_fail("iFaninIndex2 < Acb_ObjFaninNum(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbPush.c"
                  ,0x6c,"void Acb_ObjPushToFanin(Acb_Ntk_t *, int, int, int)");
  }
  if (iVar1 == local_18) {
    __assert_fail("iFaninIndex != iFaninIndex2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbPush.c"
                  ,0x6d,"void Acb_ObjPushToFanin(Acb_Ntk_t *, int, int, int)");
  }
  iVar3 = Acb_ObjFanoutNum(_iFaninIndex2_local,uTruthObjNew._4_4_);
  iVar1 = iFanin_local;
  if (iVar3 != 1) {
    __assert_fail("Acb_ObjFanoutNum(p, iFanin) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbPush.c"
                  ,0x6e,"void Acb_ObjPushToFanin(Acb_Ntk_t *, int, int, int)");
  }
  if (iVar2 == 0) {
    uTruthFan = wVar6 & s_Truths6[local_50];
  }
  else if (iVar2 == 1) {
    uTruthFan = (wVar6 ^ 0xffffffffffffffff) & s_Truths6[local_50];
  }
  else if (iVar2 == 2) {
    uTruthFan = wVar6 & (s_Truths6[local_50] ^ 0xffffffffffffffff);
  }
  else if (iVar2 == 3) {
    uTruthFan = (wVar6 ^ 0xffffffffffffffff) & (s_Truths6[local_50] ^ 0xffffffffffffffff);
  }
  else {
    if (iVar2 != 4) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbPush.c"
                    ,0x7a,"void Acb_ObjPushToFanin(Acb_Ntk_t *, int, int, int)");
    }
    uTruthFan = wVar6 ^ s_Truths6[local_50];
  }
  p_00 = &_iFaninIndex2_local->vObjTruth;
  wVar5 = Abc_Tt6RemoveVar(uTruthObj,local_18);
  Vec_WrdWriteEntry(p_00,iVar1,wVar5);
  Vec_WrdWriteEntry(&_iFaninIndex2_local->vObjTruth,uTruthObjNew._4_4_,uTruthFan);
  Acb_ObjRemoveFaninFanoutOne(_iFaninIndex2_local,iFanin_local,iFaninGiven);
  iVar1 = Acb_ObjFaninNum(_iFaninIndex2_local,uTruthObjNew._4_4_);
  if (local_50 == iVar1) {
    Acb_ObjAddFaninFanoutOne(_iFaninIndex2_local,uTruthObjNew._4_4_,iFaninGiven);
  }
  return;
}

Assistant:

void Acb_ObjPushToFanin( Acb_Ntk_t * p, int iObj, int iFaninIndex2, int iFanin )
{
    word uTruthObjNew = 0, uTruthObj = Acb_ObjTruth( p, iObj );
    word uTruthFanNew = 0, uTruthFan = Acb_ObjTruth( p, iFanin );
    int iFaninIndex = Acb_ObjWhatFanin( p, iObj, iFanin );
    int DecType = Abc_TtCheckDsdAnd( uTruthObj, iFaninIndex, iFaninIndex2, &uTruthObjNew );
    int iFanin2 = Acb_ObjFanin( p, iObj, iFaninIndex2 );
    int iFaninFaninIndex = Acb_ObjWhatFanin( p, iFanin, iFanin2 );
    if ( iFaninFaninIndex == -1 )
        iFaninFaninIndex = Acb_ObjFaninNum(p, iFanin); 
    assert( !Acb_ObjIsCio(p, iObj) );
    assert( !Acb_ObjIsCio(p, iFanin) );
    assert( iFaninIndex  < Acb_ObjFaninNum(p, iObj) );
    assert( iFaninIndex2 < Acb_ObjFaninNum(p, iObj) );
    assert( iFaninIndex != iFaninIndex2 );
    assert( Acb_ObjFanoutNum(p, iFanin) == 1 );
    // compute new function of the fanout
    if ( DecType == 0 )      //  i *  j
        uTruthFanNew =  uTruthFan &  s_Truths6[iFaninFaninIndex];
    else if ( DecType == 1 ) //  i * !j
        uTruthFanNew = ~uTruthFan &  s_Truths6[iFaninFaninIndex];
    else if ( DecType == 2 ) // !i *  j
        uTruthFanNew =  uTruthFan & ~s_Truths6[iFaninFaninIndex];
    else if ( DecType == 3 ) // !i * !j
        uTruthFanNew = ~uTruthFan & ~s_Truths6[iFaninFaninIndex];
    else if ( DecType == 4 ) //  i #  j
        uTruthFanNew =  uTruthFan ^  s_Truths6[iFaninFaninIndex];
    else assert( 0 );
    // update functions
    Vec_WrdWriteEntry( &p->vObjTruth, iObj, Abc_Tt6RemoveVar(uTruthObjNew, iFaninIndex2) );
    Vec_WrdWriteEntry( &p->vObjTruth, iFanin, uTruthFanNew );
    // update fanins
    Acb_ObjRemoveFaninFanoutOne( p, iObj, iFanin2 );
    if ( iFaninFaninIndex == Acb_ObjFaninNum(p, iFanin) ) // adding new
        Acb_ObjAddFaninFanoutOne( p, iFanin, iFanin2 );
}